

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O3

void anon_unknown.dwarf_23be6::gen2(Value **L,Value **R,int *Budget,int Width)

{
  uint uVar1;
  Value *pVVar2;
  
  pVVar2 = genVal(Budget,Width,true,true);
  *L = pVVar2;
  if (pVVar2 != (Value *)0x0) {
    pVVar2 = genVal(Budget,Width,0x13 < (byte)pVVar2[0x10],true);
    *R = pVVar2;
    uVar1 = rand();
    if ((uVar1 & 1) == 0) {
      pVVar2 = *L;
      *L = *R;
      *R = pVVar2;
    }
    return;
  }
  __assert_fail("Val && \"isa<> used on a null pointer\"",
                "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x68,
                "static bool llvm::isa_impl_cl<llvm::Constant, const llvm::Value *>::doit(const From *) [To = llvm::Constant, From = const llvm::Value *]"
               );
}

Assistant:

void gen2(Value *&L, Value *&R, int &Budget, int Width) {
  L = genVal(Budget, Width, true);
  R = genVal(Budget, Width, !isa<Constant>(L) && !isa<UndefValue>(L));
  if ((rand() & 1) == 0) {
    Value *T = L;
    L = R;
    R = T;
  }
}